

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-write-fail.c
# Opt level: O1

int run_test_tcp_write_fail(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  long extraout_RAX;
  long lVar3;
  undefined8 unaff_RBX;
  undefined1 *puVar4;
  uv_stream_t *puVar5;
  uv_write_t *puVar6;
  uv_connect_t *puVar7;
  sockaddr_in addr;
  uv_tcp_t client;
  undefined1 auStack_130 [16];
  code *pcStack_120;
  undefined1 local_110 [16];
  undefined1 local_100 [248];
  
  puVar6 = (uv_write_t *)0x194b6a;
  iVar2 = 0x23a3;
  pcStack_120 = (code *)0x1746aa;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_110);
  if (iVar1 == 0) {
    pcStack_120 = (code *)0x1746b7;
    puVar6 = (uv_write_t *)uv_default_loop();
    iVar2 = (int)local_100;
    pcStack_120 = (code *)0x1746c4;
    iVar1 = uv_tcp_init();
    if (iVar1 != 0) goto LAB_0017475b;
    puVar7 = &connect_req;
    puVar4 = local_100;
    pcStack_120 = (code *)0x1746e9;
    iVar1 = uv_tcp_connect(&connect_req,puVar4,local_110,connect_cb);
    iVar2 = (int)puVar4;
    puVar6 = (uv_write_t *)puVar7;
    if (iVar1 != 0) goto LAB_00174760;
    pcStack_120 = (code *)0x1746f2;
    puVar6 = (uv_write_t *)uv_default_loop();
    iVar2 = 0;
    pcStack_120 = (code *)0x1746fc;
    uv_run();
    if (connect_cb_called != 1) goto LAB_00174765;
    if (write_cb_called != 1) goto LAB_0017476a;
    if (close_cb_called != 1) goto LAB_0017476f;
    pcStack_120 = (code *)0x17471c;
    unaff_RBX = uv_default_loop();
    pcStack_120 = (code *)0x174730;
    uv_walk(unaff_RBX,close_walk_cb,0);
    iVar2 = 0;
    pcStack_120 = (code *)0x17473a;
    uv_run(unaff_RBX);
    pcStack_120 = (code *)0x17473f;
    puVar6 = (uv_write_t *)uv_default_loop();
    pcStack_120 = (code *)0x174747;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_120 = (code *)0x17475b;
    run_test_tcp_write_fail_cold_1();
LAB_0017475b:
    pcStack_120 = (code *)0x174760;
    run_test_tcp_write_fail_cold_2();
LAB_00174760:
    pcStack_120 = (code *)0x174765;
    run_test_tcp_write_fail_cold_3();
LAB_00174765:
    pcStack_120 = (code *)0x17476a;
    run_test_tcp_write_fail_cold_4();
LAB_0017476a:
    pcStack_120 = (code *)0x17476f;
    run_test_tcp_write_fail_cold_5();
LAB_0017476f:
    pcStack_120 = (code *)0x174774;
    run_test_tcp_write_fail_cold_6();
  }
  pcStack_120 = connect_cb;
  run_test_tcp_write_fail_cold_7();
  puVar5 = connect_req.handle;
  pcStack_120 = (code *)unaff_RBX;
  if (puVar6 == (uv_write_t *)&connect_req) {
    if (iVar2 != 0) goto LAB_001747fe;
    connect_cb_called = connect_cb_called + 1;
    puVar6 = (uv_write_t *)connect_req.handle;
    iVar2 = (int)auStack_130;
    iVar1 = uv_fileno();
    if (iVar1 != 0) goto LAB_00174803;
    puVar6 = (uv_write_t *)(auStack_130._0_8_ & 0xffffffff);
    iVar1 = close(auStack_130._0_4_);
    if (iVar1 == 0) {
      auStack_130 = uv_buf_init("hello\n",6);
      puVar6 = &write_req;
      iVar1 = uv_write(&write_req,puVar5,auStack_130,1,write_cb);
      iVar2 = (int)puVar5;
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0017480d;
    }
  }
  else {
    connect_cb_cold_1();
LAB_001747fe:
    connect_cb_cold_2();
LAB_00174803:
    connect_cb_cold_3();
  }
  connect_cb_cold_4();
LAB_0017480d:
  connect_cb_cold_5();
  if ((uv_stream_t *)puVar6 == (uv_stream_t *)0x0) {
    write_cb_cold_3();
    lVar3 = extraout_RAX;
  }
  else {
    lVar3 = _stderr;
    if (iVar2 != 0) {
      write_cb_cold_1();
      return extraout_EAX;
    }
  }
  write_cb_cold_2();
  if (lVar3 != 0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_00;
  }
  close_cb_cold_1();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = uv_close(lVar3,0);
  return iVar2;
}

Assistant:

TEST_IMPL(tcp_write_fail) {
  struct sockaddr_in addr;
  uv_tcp_t client;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  r = uv_tcp_connect(&connect_req,
                     &client,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT(r == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(connect_cb_called == 1);
  ASSERT(write_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}